

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::deleteVertexArrays
          (ReferenceContext *this,int numArrays,deUint32 *vertexArrays)

{
  VertexArray *vertexArray;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)numArrays;
  if (numArrays < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if (vertexArrays[uVar1] != 0) {
      vertexArray = rc::ObjectManager<sglr::rc::VertexArray>::find
                              (&this->m_vertexArrays,vertexArrays[uVar1]);
      if (vertexArray != (VertexArray *)0x0) {
        deleteVertexArray(this,vertexArray);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::deleteVertexArrays (int numArrays, const deUint32* vertexArrays)
{
	for (int i = 0; i < numArrays; i++)
	{
		deUint32		name		= vertexArrays[i];
		VertexArray*	vertexArray	= name ? m_vertexArrays.find(name) : DE_NULL;

		if (vertexArray)
			deleteVertexArray(vertexArray);
	}
}